

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_glnodes.cpp
# Opt level: O3

bool MatchHeader(char *label,char *hdata)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  size_t __n;
  
  if (*(short *)(hdata + 4) != 0x3d4c || *(int *)hdata != 0x4556454c) {
    return false;
  }
  sVar3 = strlen(label);
  __n = 8;
  if (sVar3 < 8) {
    __n = sVar3;
  }
  iVar2 = strncasecmp(hdata + 6,label,__n);
  if (iVar2 == 0) {
    bVar1 = hdata[__n + 6] == '\n' || hdata[__n + 6] == '\r';
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool MatchHeader(const char * label, const char * hdata)
{
	if (memcmp(hdata, "LEVEL=", 6) == 0)
	{
		size_t labellen = strlen(label);
		labellen = MIN(size_t(8), labellen);

		if (strnicmp(hdata+6, label, labellen)==0 && 
			(hdata[6+labellen]==0xa || hdata[6+labellen]==0xd))
		{
			return true;
		}
	}
	return false;
}